

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemcontext.h
# Opt level: O3

void __thiscall
cookmem::SimpleMemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::~SimpleMemContext
          (SimpleMemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this)

{
  MemSegment *pMVar1;
  MemSegment *__addr;
  
  (this->super_MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>)._vptr_MemContext =
       (_func_int **)&PTR__MemContext_00105da8;
  __addr = (this->super_MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>).m_pool.
           m_segList;
  while (__addr != (MemSegment *)0x0) {
    pMVar1 = __addr->m_next;
    munmap(__addr,__addr->m_size);
    __addr = pMVar1;
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~MemContext()
    {
    }